

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunks.hpp
# Opt level: O0

iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>_>
* __thiscall
burst::buffered_chunks_t::operator()
          (iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>_>
           *__return_storage_ptr__,buffered_chunks_t *this,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *args,
          int *args_1)

{
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  local_140;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  local_100;
  undefined1 local_a8 [8];
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int> end;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int> begin
  ;
  int *args_local_1;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *args_local;
  buffered_chunks_t *this_local;
  
  make_buffered_chunk_iterator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,int>
            ((buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
              *)&end.m_chunk_end,(burst *)args,
             (iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *)
             (ulong)(uint)*args_1,(int)args_1);
  make_buffered_chunk_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,int>
            (local_a8,(burst *)&end.m_chunk_end);
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>::
  buffered_chunk_iterator
            (&local_100,
             (buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
              *)&end.m_chunk_end);
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>::
  buffered_chunk_iterator
            (&local_140,
             (buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
              *)local_a8);
  boost::
  make_iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,int>>
            (__return_storage_ptr__,(boost *)&local_100,&local_140,
             (buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
              *)args_1);
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>::
  ~buffered_chunk_iterator(&local_140);
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>::
  ~buffered_chunk_iterator(&local_100);
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>::
  ~buffered_chunk_iterator
            ((buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
              *)local_a8);
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>::
  ~buffered_chunk_iterator
            ((buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
              *)&end.m_chunk_end);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_buffered_chunk_iterator(std::forward<Args>(args)...);
            auto end = make_buffered_chunk_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }